

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

string * units::getCommodityName_abi_cxx11_(uint32_t commodity)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  uint in_ESI;
  string *in_RDI;
  const_iterator fnd;
  iterator fnd2;
  string *ret;
  unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_ffffffffffffff28;
  char in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_89 [2];
  undefined1 local_45;
  allocator<char> local_31;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_18;
  uint local_c;
  
  local_c = in_ESI;
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (memory_order)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x757f09), !bVar1)) {
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffff18,(key_type *)0x757f21);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::__detail::operator==(&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    *)0x757f67);
      std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return in_RDI;
    }
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::find(in_stack_ffffffffffffff18,(key_type *)0x757f95);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::end(in_stack_ffffffffffffff18);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((local_c & 0x7c000000) == 0x40000000) {
      local_45 = 0;
      std::__cxx11::string::string(in_stack_ffffffffffffff30);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      while( true ) {
        bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x758102);
        bVar1 = false;
        if (!bVar2) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                             (in_stack_ffffffffffffff20);
          bVar1 = *pvVar3 == '_';
        }
        if (!bVar1) break;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(in_stack_ffffffffffffff20);
      }
    }
    else {
      this = local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                 (allocator<char> *)in_stack_ffffffffffffff50);
      std::__cxx11::to_string((uint)((ulong)in_RDI >> 0x20));
      std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),(char *)this);
      std::__cxx11::string::~string(this);
      std::__cxx11::string::~string(this);
      std::__cxx11::string::~string(this);
      std::allocator<char>::~allocator((allocator<char> *)local_89);
    }
  }
  else {
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false> *)
               0x757fdb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
               (allocator<char> *)in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_31);
  }
  return in_RDI;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}